

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool(DescriptorPool *this,DescriptorPool *underlay)

{
  Tables *this_00;
  DescriptorPool *underlay_local;
  DescriptorPool *this_local;
  
  this->mutex_ = (Mutex *)0x0;
  this->fallback_database_ = (DescriptorDatabase *)0x0;
  this->default_error_collector_ = (ErrorCollector *)0x0;
  this->underlay_ = underlay;
  this_00 = (Tables *)operator_new(0x1c8);
  Tables::Tables(this_00);
  internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::scoped_ptr(&this->tables_,this_00)
  ;
  this->enforce_dependencies_ = true;
  this->allow_unknown_ = false;
  return;
}

Assistant:

DescriptorPool::DescriptorPool(const DescriptorPool* underlay)
  : mutex_(NULL),
    fallback_database_(NULL),
    default_error_collector_(NULL),
    underlay_(underlay),
    tables_(new Tables),
    enforce_dependencies_(true),
    allow_unknown_(false) {}